

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O3

int Quantize2Blocks_SSE2(int16_t *in,int16_t *out,VP8Matrix *mtx)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  unkbyte10 Var19;
  unkbyte10 Var20;
  int iVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  short sVar27;
  short sVar28;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  undefined1 auVar29 [16];
  short sVar43;
  short sVar44;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  undefined1 auVar45 [16];
  short sVar52;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  int iVar74;
  short sVar79;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [12];
  short sVar85;
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar86;
  short sVar94;
  undefined1 auVar88 [12];
  short sVar93;
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar95 [16];
  undefined1 auVar75 [12];
  undefined1 auVar78 [16];
  undefined1 auVar82 [16];
  undefined1 auVar87 [12];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  
  auVar24 = _DAT_00151900;
  auVar23 = *(undefined1 (*) [16])in;
  auVar66 = *(undefined1 (*) [16])(in + 8);
  auVar57 = *(undefined1 (*) [16])mtx->iq_;
  auVar71 = *(undefined1 (*) [16])(mtx->iq_ + 8);
  sVar27 = auVar23._0_2_;
  sVar85 = -sVar27;
  sVar30 = auVar23._2_2_;
  sVar93 = -sVar30;
  sVar32 = auVar23._4_2_;
  sVar60 = -sVar32;
  sVar34 = auVar23._6_2_;
  sVar61 = -sVar34;
  sVar36 = auVar23._8_2_;
  sVar62 = -sVar36;
  sVar38 = auVar23._10_2_;
  sVar63 = -sVar38;
  sVar40 = auVar23._12_2_;
  sVar64 = -sVar40;
  sVar42 = auVar23._14_2_;
  sVar65 = -sVar42;
  auVar29 = psraw(auVar23,0xf);
  sVar28 = auVar66._0_2_;
  sVar79 = -sVar28;
  sVar31 = auVar66._2_2_;
  sVar94 = -sVar31;
  sVar33 = auVar66._4_2_;
  sVar1 = -sVar33;
  sVar35 = auVar66._6_2_;
  sVar2 = -sVar35;
  sVar37 = auVar66._8_2_;
  sVar3 = -sVar37;
  sVar39 = auVar66._10_2_;
  sVar4 = -sVar39;
  sVar41 = auVar66._12_2_;
  sVar5 = -sVar41;
  sVar43 = auVar66._14_2_;
  sVar6 = -sVar43;
  auVar45 = psraw(auVar66,0xf);
  auVar81._0_2_ =
       mtx->sharpen_[0] + ((ushort)(sVar85 < sVar27) * sVar27 | (ushort)(sVar85 >= sVar27) * sVar85)
  ;
  auVar81._2_2_ =
       mtx->sharpen_[1] + ((ushort)(sVar93 < sVar30) * sVar30 | (ushort)(sVar93 >= sVar30) * sVar93)
  ;
  auVar81._4_2_ =
       mtx->sharpen_[2] + ((ushort)(sVar60 < sVar32) * sVar32 | (ushort)(sVar60 >= sVar32) * sVar60)
  ;
  auVar81._6_2_ =
       mtx->sharpen_[3] + ((ushort)(sVar61 < sVar34) * sVar34 | (ushort)(sVar61 >= sVar34) * sVar61)
  ;
  auVar81._8_2_ =
       mtx->sharpen_[4] + ((ushort)(sVar62 < sVar36) * sVar36 | (ushort)(sVar62 >= sVar36) * sVar62)
  ;
  auVar81._10_2_ =
       mtx->sharpen_[5] + ((ushort)(sVar63 < sVar38) * sVar38 | (ushort)(sVar63 >= sVar38) * sVar63)
  ;
  auVar81._12_2_ =
       mtx->sharpen_[6] + ((ushort)(sVar64 < sVar40) * sVar40 | (ushort)(sVar64 >= sVar40) * sVar64)
  ;
  auVar81._14_2_ =
       mtx->sharpen_[7] + ((ushort)(sVar65 < sVar42) * sVar42 | (ushort)(sVar65 >= sVar42) * sVar65)
  ;
  auVar89._0_2_ =
       mtx->sharpen_[8] + ((ushort)(sVar79 < sVar28) * sVar28 | (ushort)(sVar79 >= sVar28) * sVar79)
  ;
  auVar89._2_2_ =
       mtx->sharpen_[9] + ((ushort)(sVar94 < sVar31) * sVar31 | (ushort)(sVar94 >= sVar31) * sVar94)
  ;
  auVar89._4_2_ =
       mtx->sharpen_[10] + ((ushort)(sVar1 < sVar33) * sVar33 | (ushort)(sVar1 >= sVar33) * sVar1);
  auVar89._6_2_ =
       mtx->sharpen_[0xb] + ((ushort)(sVar2 < sVar35) * sVar35 | (ushort)(sVar2 >= sVar35) * sVar2);
  auVar89._8_2_ =
       mtx->sharpen_[0xc] + ((ushort)(sVar3 < sVar37) * sVar37 | (ushort)(sVar3 >= sVar37) * sVar3);
  auVar89._10_2_ =
       mtx->sharpen_[0xd] + ((ushort)(sVar4 < sVar39) * sVar39 | (ushort)(sVar4 >= sVar39) * sVar4);
  auVar89._12_2_ =
       mtx->sharpen_[0xe] + ((ushort)(sVar5 < sVar41) * sVar41 | (ushort)(sVar5 >= sVar41) * sVar5);
  auVar89._14_2_ =
       mtx->sharpen_[0xf] + ((ushort)(sVar6 < sVar43) * sVar43 | (ushort)(sVar6 >= sVar43) * sVar6);
  auVar66 = pmulhuw(auVar81,auVar57);
  sVar85 = auVar81._6_2_ * auVar57._6_2_;
  auVar23 = pmulhuw(auVar89,auVar71);
  sVar93 = auVar89._6_2_ * auVar71._6_2_;
  iVar21 = CONCAT22(auVar66._6_2_,sVar85);
  Var19 = CONCAT64(CONCAT42(iVar21,auVar66._4_2_),CONCAT22(auVar81._4_2_ * auVar57._4_2_,sVar85));
  auVar15._4_8_ = (long)((unkuint10)Var19 >> 0x10);
  auVar15._2_2_ = auVar66._2_2_;
  auVar15._0_2_ = auVar81._2_2_ * auVar57._2_2_;
  iVar74 = CONCAT22(auVar66._8_2_,auVar81._8_2_ * auVar57._8_2_);
  auVar80._0_8_ = CONCAT26(auVar66._10_2_,CONCAT24(auVar81._10_2_ * auVar57._10_2_,iVar74));
  auVar80._8_2_ = auVar81._12_2_ * auVar57._12_2_;
  auVar80._10_2_ = auVar66._12_2_;
  auVar82._12_2_ = auVar81._14_2_ * auVar57._14_2_;
  auVar82._0_12_ = auVar80;
  auVar82._14_2_ = auVar66._14_2_;
  iVar22 = CONCAT22(auVar23._6_2_,sVar93);
  Var20 = CONCAT64(CONCAT42(iVar22,auVar23._4_2_),CONCAT22(auVar89._4_2_ * auVar71._4_2_,sVar93));
  auVar16._4_8_ = (long)((unkuint10)Var20 >> 0x10);
  auVar16._2_2_ = auVar23._2_2_;
  auVar16._0_2_ = auVar89._2_2_ * auVar71._2_2_;
  iVar86 = CONCAT22(auVar23._8_2_,auVar89._8_2_ * auVar71._8_2_);
  auVar87._0_8_ = CONCAT26(auVar23._10_2_,CONCAT24(auVar89._10_2_ * auVar71._10_2_,iVar86));
  auVar87._8_2_ = auVar89._12_2_ * auVar71._12_2_;
  auVar87._10_2_ = auVar23._12_2_;
  auVar90._12_2_ = auVar89._14_2_ * auVar71._14_2_;
  auVar90._0_12_ = auVar87;
  auVar90._14_2_ = auVar23._14_2_;
  auVar53._0_4_ =
       (int)(mtx->bias_[0] + CONCAT22(auVar66._0_2_,auVar81._0_2_ * auVar57._0_2_)) >> 0x11;
  auVar53._4_4_ = (int)(mtx->bias_[1] + auVar15._0_4_) >> 0x11;
  auVar53._8_4_ = (int)(mtx->bias_[2] + (int)((unkuint10)Var19 >> 0x10)) >> 0x11;
  auVar53._12_4_ = (int)(mtx->bias_[3] + iVar21) >> 0x11;
  auVar66._0_4_ = (int)(mtx->bias_[4] + iVar74) >> 0x11;
  auVar66._4_4_ = (int)(mtx->bias_[5] + (int)((ulong)auVar80._0_8_ >> 0x20)) >> 0x11;
  auVar66._8_4_ = (int)(mtx->bias_[6] + auVar80._8_4_) >> 0x11;
  auVar66._12_4_ = (int)(mtx->bias_[7] + auVar82._12_4_) >> 0x11;
  auVar66 = packssdw(auVar53,auVar66);
  auVar67._0_4_ =
       (int)(mtx->bias_[8] + CONCAT22(auVar23._0_2_,auVar89._0_2_ * auVar71._0_2_)) >> 0x11;
  auVar67._4_4_ = (int)(mtx->bias_[9] + auVar16._0_4_) >> 0x11;
  auVar67._8_4_ = (int)(mtx->bias_[10] + (int)((unkuint10)Var20 >> 0x10)) >> 0x11;
  auVar67._12_4_ = (int)(mtx->bias_[0xb] + iVar22) >> 0x11;
  auVar76._0_4_ = (int)(mtx->bias_[0xc] + iVar86) >> 0x11;
  auVar76._4_4_ = (int)(mtx->bias_[0xd] + (int)((ulong)auVar87._0_8_ >> 0x20)) >> 0x11;
  auVar76._8_4_ = (int)(mtx->bias_[0xe] + auVar87._8_4_) >> 0x11;
  auVar76._12_4_ = (int)(mtx->bias_[0xf] + auVar90._12_4_) >> 0x11;
  auVar23 = packssdw(auVar67,auVar76);
  sVar85 = (short)DAT_00151900;
  sVar93 = auVar66._0_2_;
  auVar54._0_2_ = (ushort)(sVar85 < sVar93) * sVar85 | (ushort)(sVar85 >= sVar93) * sVar93;
  sVar93 = DAT_00151900._2_2_;
  sVar60 = auVar66._2_2_;
  auVar54._2_2_ = (ushort)(sVar93 < sVar60) * sVar93 | (ushort)(sVar93 >= sVar60) * sVar60;
  sVar60 = DAT_00151900._4_2_;
  sVar61 = auVar66._4_2_;
  auVar54._4_2_ = (ushort)(sVar60 < sVar61) * sVar60 | (ushort)(sVar60 >= sVar61) * sVar61;
  sVar61 = DAT_00151900._6_2_;
  sVar62 = auVar66._6_2_;
  auVar54._6_2_ = (ushort)(sVar61 < sVar62) * sVar61 | (ushort)(sVar61 >= sVar62) * sVar62;
  sVar62 = DAT_00151900._8_2_;
  sVar63 = auVar66._8_2_;
  auVar54._8_2_ = (ushort)(sVar62 < sVar63) * sVar62 | (ushort)(sVar62 >= sVar63) * sVar63;
  sVar63 = DAT_00151900._10_2_;
  sVar64 = auVar66._10_2_;
  auVar54._10_2_ = (ushort)(sVar63 < sVar64) * sVar63 | (ushort)(sVar63 >= sVar64) * sVar64;
  sVar64 = DAT_00151900._12_2_;
  sVar65 = auVar66._12_2_;
  sVar79 = auVar66._14_2_;
  auVar54._12_2_ = (ushort)(sVar64 < sVar65) * sVar64 | (ushort)(sVar64 >= sVar65) * sVar65;
  sVar65 = DAT_00151900._14_2_;
  auVar54._14_2_ = (ushort)(sVar65 < sVar79) * sVar65 | (ushort)(sVar65 >= sVar79) * sVar79;
  sVar79 = auVar23._0_2_;
  auVar68._0_2_ = (ushort)(sVar85 < sVar79) * sVar85 | (ushort)(sVar85 >= sVar79) * sVar79;
  sVar79 = auVar23._2_2_;
  auVar68._2_2_ = (ushort)(sVar93 < sVar79) * sVar93 | (ushort)(sVar93 >= sVar79) * sVar79;
  sVar79 = auVar23._4_2_;
  auVar68._4_2_ = (ushort)(sVar60 < sVar79) * sVar60 | (ushort)(sVar60 >= sVar79) * sVar79;
  sVar79 = auVar23._6_2_;
  auVar68._6_2_ = (ushort)(sVar61 < sVar79) * sVar61 | (ushort)(sVar61 >= sVar79) * sVar79;
  sVar79 = auVar23._8_2_;
  auVar68._8_2_ = (ushort)(sVar62 < sVar79) * sVar62 | (ushort)(sVar62 >= sVar79) * sVar79;
  sVar79 = auVar23._10_2_;
  auVar68._10_2_ = (ushort)(sVar63 < sVar79) * sVar63 | (ushort)(sVar63 >= sVar79) * sVar79;
  sVar79 = auVar23._12_2_;
  sVar94 = auVar23._14_2_;
  auVar68._12_2_ = (ushort)(sVar64 < sVar79) * sVar64 | (ushort)(sVar64 >= sVar79) * sVar79;
  auVar68._14_2_ = (ushort)(sVar65 < sVar94) * sVar65 | (ushort)(sVar65 >= sVar94) * sVar94;
  auVar54 = auVar54 ^ auVar29;
  auVar68 = auVar68 ^ auVar45;
  auVar55._0_2_ = auVar54._0_2_ - auVar29._0_2_;
  auVar55._2_2_ = auVar54._2_2_ - auVar29._2_2_;
  auVar55._4_2_ = auVar54._4_2_ - auVar29._4_2_;
  auVar55._6_2_ = auVar54._6_2_ - auVar29._6_2_;
  auVar55._8_2_ = auVar54._8_2_ - auVar29._8_2_;
  auVar55._10_2_ = auVar54._10_2_ - auVar29._10_2_;
  auVar55._12_2_ = auVar54._12_2_ - auVar29._12_2_;
  auVar55._14_2_ = auVar54._14_2_ - auVar29._14_2_;
  auVar69._0_2_ = auVar68._0_2_ - auVar45._0_2_;
  auVar69._2_2_ = auVar68._2_2_ - auVar45._2_2_;
  auVar69._4_2_ = auVar68._4_2_ - auVar45._4_2_;
  auVar69._6_2_ = auVar68._6_2_ - auVar45._6_2_;
  auVar69._8_2_ = auVar68._8_2_ - auVar45._8_2_;
  auVar69._10_2_ = auVar68._10_2_ - auVar45._10_2_;
  auVar69._12_2_ = auVar68._12_2_ - auVar45._12_2_;
  auVar69._14_2_ = auVar68._14_2_ - auVar45._14_2_;
  auVar23._0_2_ = mtx->q_[0] * auVar55._0_2_;
  auVar23._2_2_ = mtx->q_[1] * auVar55._2_2_;
  auVar23._4_2_ = mtx->q_[2] * auVar55._4_2_;
  auVar23._6_2_ = mtx->q_[3] * auVar55._6_2_;
  auVar23._8_2_ = mtx->q_[4] * auVar55._8_2_;
  auVar23._10_2_ = mtx->q_[5] * auVar55._10_2_;
  auVar23._12_2_ = mtx->q_[6] * auVar55._12_2_;
  auVar23._14_2_ = mtx->q_[7] * auVar55._14_2_;
  auVar25._0_2_ = mtx->q_[8] * auVar69._0_2_;
  auVar25._2_2_ = mtx->q_[9] * auVar69._2_2_;
  auVar25._4_2_ = mtx->q_[10] * auVar69._4_2_;
  auVar25._6_2_ = mtx->q_[0xb] * auVar69._6_2_;
  auVar25._8_2_ = mtx->q_[0xc] * auVar69._8_2_;
  auVar25._10_2_ = mtx->q_[0xd] * auVar69._10_2_;
  auVar25._12_2_ = mtx->q_[0xe] * auVar69._12_2_;
  auVar25._14_2_ = mtx->q_[0xf] * auVar69._14_2_;
  *(undefined1 (*) [16])in = auVar23;
  *(undefined1 (*) [16])(in + 8) = auVar25;
  auVar23 = pshufhw(auVar23,auVar55,0xc6);
  auVar29._0_4_ = auVar23._0_4_;
  auVar29._8_4_ = auVar23._8_4_;
  auVar29._4_4_ = auVar23._12_4_;
  auVar29._12_4_ = auVar23._4_4_;
  auVar23 = pshufhw(auVar29,auVar29,0x39);
  auVar66 = pshuflw(auVar25,auVar69,0xc6);
  auVar26._0_4_ = auVar66._0_4_;
  auVar26._12_4_ = auVar66._12_4_;
  auVar26._4_4_ = auVar66._8_4_;
  auVar26._8_4_ = auVar66._4_4_;
  auVar66 = pshuflw(auVar26,auVar26,0x39);
  *(undefined1 (*) [16])out = auVar23;
  *(undefined1 (*) [16])(out + 8) = auVar66;
  auVar23 = packsswb(auVar23,auVar66);
  out[3] = auVar69._0_2_;
  out[0xc] = auVar55._14_2_;
  auVar45[0] = -(auVar23[0] == '\0');
  auVar45[1] = -(auVar23[1] == '\0');
  auVar45[2] = -(auVar23[2] == '\0');
  auVar45[3] = -(auVar23[3] == '\0');
  auVar45[4] = -(auVar23[4] == '\0');
  auVar45[5] = -(auVar23[5] == '\0');
  auVar45[6] = -(auVar23[6] == '\0');
  auVar45[7] = -(auVar23[7] == '\0');
  auVar45[8] = -(auVar23[8] == '\0');
  auVar45[9] = -(auVar23[9] == '\0');
  auVar45[10] = -(auVar23[10] == '\0');
  auVar45[0xb] = -(auVar23[0xb] == '\0');
  auVar45[0xc] = -(auVar23[0xc] == '\0');
  auVar45[0xd] = -(auVar23[0xd] == '\0');
  auVar45[0xe] = -(auVar23[0xe] == '\0');
  auVar45[0xf] = -(auVar23[0xf] == '\0');
  auVar23 = *(undefined1 (*) [16])(in + 0x10);
  auVar66 = *(undefined1 (*) [16])(in + 0x18);
  uVar7 = mtx->q_[8];
  uVar8 = mtx->q_[9];
  uVar9 = mtx->q_[10];
  uVar10 = mtx->q_[0xb];
  uVar11 = mtx->q_[0xc];
  uVar12 = mtx->q_[0xd];
  uVar13 = mtx->q_[0xe];
  uVar14 = mtx->q_[0xf];
  auVar57 = *(undefined1 (*) [16])mtx->iq_;
  auVar71 = *(undefined1 (*) [16])(mtx->iq_ + 8);
  sVar28 = auVar23._0_2_;
  sVar79 = -sVar28;
  sVar31 = auVar23._2_2_;
  sVar94 = -sVar31;
  sVar33 = auVar23._4_2_;
  sVar1 = -sVar33;
  sVar35 = auVar23._6_2_;
  sVar2 = -sVar35;
  sVar37 = auVar23._8_2_;
  sVar3 = -sVar37;
  sVar39 = auVar23._10_2_;
  sVar4 = -sVar39;
  sVar41 = auVar23._12_2_;
  sVar5 = -sVar41;
  sVar43 = auVar23._14_2_;
  sVar6 = -sVar43;
  auVar23 = psraw(auVar23,0xf);
  sVar44 = auVar66._0_2_;
  sVar27 = -sVar44;
  sVar46 = auVar66._2_2_;
  sVar30 = -sVar46;
  sVar47 = auVar66._4_2_;
  sVar32 = -sVar47;
  sVar48 = auVar66._6_2_;
  sVar34 = -sVar48;
  sVar49 = auVar66._8_2_;
  sVar36 = -sVar49;
  sVar50 = auVar66._10_2_;
  sVar38 = -sVar50;
  sVar51 = auVar66._12_2_;
  sVar40 = -sVar51;
  sVar52 = auVar66._14_2_;
  sVar42 = -sVar52;
  auVar66 = psraw(auVar66,0xf);
  auVar91._0_2_ =
       mtx->sharpen_[0] + ((ushort)(sVar79 < sVar28) * sVar28 | (ushort)(sVar79 >= sVar28) * sVar79)
  ;
  auVar91._2_2_ =
       mtx->sharpen_[1] + ((ushort)(sVar94 < sVar31) * sVar31 | (ushort)(sVar94 >= sVar31) * sVar94)
  ;
  auVar91._4_2_ =
       mtx->sharpen_[2] + ((ushort)(sVar1 < sVar33) * sVar33 | (ushort)(sVar1 >= sVar33) * sVar1);
  auVar91._6_2_ =
       mtx->sharpen_[3] + ((ushort)(sVar2 < sVar35) * sVar35 | (ushort)(sVar2 >= sVar35) * sVar2);
  auVar91._8_2_ =
       mtx->sharpen_[4] + ((ushort)(sVar3 < sVar37) * sVar37 | (ushort)(sVar3 >= sVar37) * sVar3);
  auVar91._10_2_ =
       mtx->sharpen_[5] + ((ushort)(sVar4 < sVar39) * sVar39 | (ushort)(sVar4 >= sVar39) * sVar4);
  auVar91._12_2_ =
       mtx->sharpen_[6] + ((ushort)(sVar5 < sVar41) * sVar41 | (ushort)(sVar5 >= sVar41) * sVar5);
  auVar91._14_2_ =
       mtx->sharpen_[7] + ((ushort)(sVar6 < sVar43) * sVar43 | (ushort)(sVar6 >= sVar43) * sVar6);
  auVar77._0_2_ =
       mtx->sharpen_[8] + ((ushort)(sVar27 < sVar44) * sVar44 | (ushort)(sVar27 >= sVar44) * sVar27)
  ;
  auVar77._2_2_ =
       mtx->sharpen_[9] + ((ushort)(sVar30 < sVar46) * sVar46 | (ushort)(sVar30 >= sVar46) * sVar30)
  ;
  auVar77._4_2_ =
       mtx->sharpen_[10] +
       ((ushort)(sVar32 < sVar47) * sVar47 | (ushort)(sVar32 >= sVar47) * sVar32);
  auVar77._6_2_ =
       mtx->sharpen_[0xb] +
       ((ushort)(sVar34 < sVar48) * sVar48 | (ushort)(sVar34 >= sVar48) * sVar34);
  auVar77._8_2_ =
       mtx->sharpen_[0xc] +
       ((ushort)(sVar36 < sVar49) * sVar49 | (ushort)(sVar36 >= sVar49) * sVar36);
  auVar77._10_2_ =
       mtx->sharpen_[0xd] +
       ((ushort)(sVar38 < sVar50) * sVar50 | (ushort)(sVar38 >= sVar50) * sVar38);
  auVar77._12_2_ =
       mtx->sharpen_[0xe] +
       ((ushort)(sVar40 < sVar51) * sVar51 | (ushort)(sVar40 >= sVar51) * sVar40);
  auVar77._14_2_ =
       mtx->sharpen_[0xf] +
       ((ushort)(sVar42 < sVar52) * sVar52 | (ushort)(sVar42 >= sVar52) * sVar42);
  auVar83 = pmulhuw(auVar91,auVar57);
  sVar94 = auVar91._6_2_ * auVar57._6_2_;
  auVar29 = pmulhuw(auVar77,auVar71);
  sVar79 = auVar77._6_2_ * auVar71._6_2_;
  iVar21 = CONCAT22(auVar83._6_2_,sVar94);
  Var19 = CONCAT64(CONCAT42(iVar21,auVar83._4_2_),CONCAT22(auVar91._4_2_ * auVar57._4_2_,sVar94));
  auVar17._4_8_ = (long)((unkuint10)Var19 >> 0x10);
  auVar17._2_2_ = auVar83._2_2_;
  auVar17._0_2_ = auVar91._2_2_ * auVar57._2_2_;
  iVar86 = CONCAT22(auVar83._8_2_,auVar91._8_2_ * auVar57._8_2_);
  auVar88._0_8_ = CONCAT26(auVar83._10_2_,CONCAT24(auVar91._10_2_ * auVar57._10_2_,iVar86));
  auVar88._8_2_ = auVar91._12_2_ * auVar57._12_2_;
  auVar88._10_2_ = auVar83._12_2_;
  auVar92._12_2_ = auVar91._14_2_ * auVar57._14_2_;
  auVar92._0_12_ = auVar88;
  auVar92._14_2_ = auVar83._14_2_;
  iVar22 = CONCAT22(auVar29._6_2_,sVar79);
  Var20 = CONCAT64(CONCAT42(iVar22,auVar29._4_2_),CONCAT22(auVar77._4_2_ * auVar71._4_2_,sVar79));
  auVar18._4_8_ = (long)((unkuint10)Var20 >> 0x10);
  auVar18._2_2_ = auVar29._2_2_;
  auVar18._0_2_ = auVar77._2_2_ * auVar71._2_2_;
  iVar74 = CONCAT22(auVar29._8_2_,auVar77._8_2_ * auVar71._8_2_);
  auVar75._0_8_ = CONCAT26(auVar29._10_2_,CONCAT24(auVar77._10_2_ * auVar71._10_2_,iVar74));
  auVar75._8_2_ = auVar77._12_2_ * auVar71._12_2_;
  auVar75._10_2_ = auVar29._12_2_;
  auVar78._12_2_ = auVar77._14_2_ * auVar71._14_2_;
  auVar78._0_12_ = auVar75;
  auVar78._14_2_ = auVar29._14_2_;
  auVar56._0_4_ =
       (int)(mtx->bias_[0] + CONCAT22(auVar83._0_2_,auVar91._0_2_ * auVar57._0_2_)) >> 0x11;
  auVar56._4_4_ = (int)(mtx->bias_[1] + auVar17._0_4_) >> 0x11;
  auVar56._8_4_ = (int)(mtx->bias_[2] + (int)((unkuint10)Var19 >> 0x10)) >> 0x11;
  auVar56._12_4_ = (int)(mtx->bias_[3] + iVar21) >> 0x11;
  auVar95._0_4_ = (int)(mtx->bias_[4] + iVar86) >> 0x11;
  auVar95._4_4_ = (int)(mtx->bias_[5] + (int)((ulong)auVar88._0_8_ >> 0x20)) >> 0x11;
  auVar95._8_4_ = (int)(mtx->bias_[6] + auVar88._8_4_) >> 0x11;
  auVar95._12_4_ = (int)(mtx->bias_[7] + auVar92._12_4_) >> 0x11;
  auVar57 = packssdw(auVar56,auVar95);
  auVar70._0_4_ =
       (int)(mtx->bias_[8] + CONCAT22(auVar29._0_2_,auVar77._0_2_ * auVar71._0_2_)) >> 0x11;
  auVar70._4_4_ = (int)(mtx->bias_[9] + auVar18._0_4_) >> 0x11;
  auVar70._8_4_ = (int)(mtx->bias_[10] + (int)((unkuint10)Var20 >> 0x10)) >> 0x11;
  auVar70._12_4_ = (int)(mtx->bias_[0xb] + iVar22) >> 0x11;
  auVar84._0_4_ = (int)(mtx->bias_[0xc] + iVar74) >> 0x11;
  auVar84._4_4_ = (int)(mtx->bias_[0xd] + (int)((ulong)auVar75._0_8_ >> 0x20)) >> 0x11;
  auVar84._8_4_ = (int)(mtx->bias_[0xe] + auVar75._8_4_) >> 0x11;
  auVar84._12_4_ = (int)(mtx->bias_[0xf] + auVar78._12_4_) >> 0x11;
  auVar71 = packssdw(auVar70,auVar84);
  sVar79 = auVar57._0_2_;
  auVar58._0_2_ = (ushort)(sVar85 < sVar79) * sVar85 | (ushort)(sVar85 >= sVar79) * sVar79;
  sVar79 = auVar57._2_2_;
  auVar58._2_2_ = (ushort)(sVar93 < sVar79) * sVar93 | (ushort)(sVar93 >= sVar79) * sVar79;
  sVar79 = auVar57._4_2_;
  auVar58._4_2_ = (ushort)(sVar60 < sVar79) * sVar60 | (ushort)(sVar60 >= sVar79) * sVar79;
  sVar79 = auVar57._6_2_;
  auVar58._6_2_ = (ushort)(sVar61 < sVar79) * sVar61 | (ushort)(sVar61 >= sVar79) * sVar79;
  sVar79 = auVar57._8_2_;
  auVar58._8_2_ = (ushort)(sVar62 < sVar79) * sVar62 | (ushort)(sVar62 >= sVar79) * sVar79;
  sVar79 = auVar57._10_2_;
  auVar58._10_2_ = (ushort)(sVar63 < sVar79) * sVar63 | (ushort)(sVar63 >= sVar79) * sVar79;
  sVar79 = auVar57._12_2_;
  sVar94 = auVar57._14_2_;
  auVar58._12_2_ = (ushort)(sVar64 < sVar79) * sVar64 | (ushort)(sVar64 >= sVar79) * sVar79;
  auVar58._14_2_ = (ushort)(sVar65 < sVar94) * sVar65 | (ushort)(sVar65 >= sVar94) * sVar94;
  sVar79 = auVar71._0_2_;
  auVar72._0_2_ = (ushort)(sVar85 < sVar79) * sVar85 | (ushort)(sVar85 >= sVar79) * sVar79;
  sVar85 = auVar71._2_2_;
  auVar72._2_2_ = (ushort)(sVar93 < sVar85) * sVar93 | (ushort)(sVar93 >= sVar85) * sVar85;
  sVar85 = auVar71._4_2_;
  auVar72._4_2_ = (ushort)(sVar60 < sVar85) * sVar60 | (ushort)(sVar60 >= sVar85) * sVar85;
  sVar85 = auVar71._6_2_;
  auVar72._6_2_ = (ushort)(sVar61 < sVar85) * sVar61 | (ushort)(sVar61 >= sVar85) * sVar85;
  sVar85 = auVar71._8_2_;
  auVar72._8_2_ = (ushort)(sVar62 < sVar85) * sVar62 | (ushort)(sVar62 >= sVar85) * sVar85;
  sVar85 = auVar71._10_2_;
  auVar72._10_2_ = (ushort)(sVar63 < sVar85) * sVar63 | (ushort)(sVar63 >= sVar85) * sVar85;
  sVar85 = auVar71._12_2_;
  sVar93 = auVar71._14_2_;
  auVar72._12_2_ = (ushort)(sVar64 < sVar85) * sVar64 | (ushort)(sVar64 >= sVar85) * sVar85;
  auVar72._14_2_ = (ushort)(sVar65 < sVar93) * sVar65 | (ushort)(sVar65 >= sVar93) * sVar93;
  auVar58 = auVar58 ^ auVar23;
  auVar72 = auVar72 ^ auVar66;
  auVar59._0_2_ = auVar58._0_2_ - auVar23._0_2_;
  auVar59._2_2_ = auVar58._2_2_ - auVar23._2_2_;
  auVar59._4_2_ = auVar58._4_2_ - auVar23._4_2_;
  auVar59._6_2_ = auVar58._6_2_ - auVar23._6_2_;
  auVar59._8_2_ = auVar58._8_2_ - auVar23._8_2_;
  auVar59._10_2_ = auVar58._10_2_ - auVar23._10_2_;
  auVar59._12_2_ = auVar58._12_2_ - auVar23._12_2_;
  auVar59._14_2_ = auVar58._14_2_ - auVar23._14_2_;
  auVar73._0_2_ = auVar72._0_2_ - auVar66._0_2_;
  auVar73._2_2_ = auVar72._2_2_ - auVar66._2_2_;
  auVar73._4_2_ = auVar72._4_2_ - auVar66._4_2_;
  auVar73._6_2_ = auVar72._6_2_ - auVar66._6_2_;
  auVar73._8_2_ = auVar72._8_2_ - auVar66._8_2_;
  auVar73._10_2_ = auVar72._10_2_ - auVar66._10_2_;
  auVar73._12_2_ = auVar72._12_2_ - auVar66._12_2_;
  auVar73._14_2_ = auVar72._14_2_ - auVar66._14_2_;
  auVar83._0_2_ = mtx->q_[0] * auVar59._0_2_;
  auVar83._2_2_ = mtx->q_[1] * auVar59._2_2_;
  auVar83._4_2_ = mtx->q_[2] * auVar59._4_2_;
  auVar83._6_2_ = mtx->q_[3] * auVar59._6_2_;
  auVar83._8_2_ = mtx->q_[4] * auVar59._8_2_;
  auVar83._10_2_ = mtx->q_[5] * auVar59._10_2_;
  auVar83._12_2_ = mtx->q_[6] * auVar59._12_2_;
  auVar83._14_2_ = mtx->q_[7] * auVar59._14_2_;
  *(undefined1 (*) [16])(in + 0x10) = auVar83;
  in[0x18] = uVar7 * auVar73._0_2_;
  in[0x19] = uVar8 * auVar73._2_2_;
  in[0x1a] = uVar9 * auVar73._4_2_;
  in[0x1b] = uVar10 * auVar73._6_2_;
  in[0x1c] = uVar11 * auVar73._8_2_;
  in[0x1d] = uVar12 * auVar73._10_2_;
  in[0x1e] = uVar13 * auVar73._12_2_;
  in[0x1f] = uVar14 * auVar73._14_2_;
  auVar23 = pshufhw(auVar24,auVar59,0xc6);
  auVar57._0_4_ = auVar23._0_4_;
  auVar57._8_4_ = auVar23._8_4_;
  auVar57._4_4_ = auVar23._12_4_;
  auVar57._12_4_ = auVar23._4_4_;
  auVar23 = pshufhw(auVar57,auVar57,0x39);
  auVar66 = pshuflw(auVar83,auVar73,0xc6);
  auVar24._0_4_ = auVar66._0_4_;
  auVar24._12_4_ = auVar66._12_4_;
  auVar24._4_4_ = auVar66._8_4_;
  auVar24._8_4_ = auVar66._4_4_;
  auVar66 = pshuflw(auVar24,auVar24,0x39);
  *(undefined1 (*) [16])(out + 0x10) = auVar23;
  *(undefined1 (*) [16])(out + 0x18) = auVar66;
  auVar23 = packsswb(auVar23,auVar66);
  out[0x13] = auVar73._0_2_;
  out[0x1c] = auVar59._14_2_;
  auVar71[0] = -(auVar23[0] == '\0');
  auVar71[1] = -(auVar23[1] == '\0');
  auVar71[2] = -(auVar23[2] == '\0');
  auVar71[3] = -(auVar23[3] == '\0');
  auVar71[4] = -(auVar23[4] == '\0');
  auVar71[5] = -(auVar23[5] == '\0');
  auVar71[6] = -(auVar23[6] == '\0');
  auVar71[7] = -(auVar23[7] == '\0');
  auVar71[8] = -(auVar23[8] == '\0');
  auVar71[9] = -(auVar23[9] == '\0');
  auVar71[10] = -(auVar23[10] == '\0');
  auVar71[0xb] = -(auVar23[0xb] == '\0');
  auVar71[0xc] = -(auVar23[0xc] == '\0');
  auVar71[0xd] = -(auVar23[0xd] == '\0');
  auVar71[0xe] = -(auVar23[0xe] == '\0');
  auVar71[0xf] = -(auVar23[0xf] == '\0');
  return (uint)((ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar45[0xf] >> 7) << 0xf) != 0xffff) +
         (uint)((ushort)((ushort)(SUB161(auVar71 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar71 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar71 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar71 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar71 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar71 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar71 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar71 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar71 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar71 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar71 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar71 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar71 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar71 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar71 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar71[0xf] >> 7) << 0xf) != 0xffff) * 2;
}

Assistant:

static WEBP_INLINE int DoQuantizeBlock_SSE2(int16_t in[16], int16_t out[16],
                                            const uint16_t* const sharpen,
                                            const VP8Matrix* const mtx) {
  const __m128i max_coeff_2047 = _mm_set1_epi16(MAX_LEVEL);
  const __m128i zero = _mm_setzero_si128();
  __m128i coeff0, coeff8;
  __m128i out0, out8;
  __m128i packed_out;

  // Load all inputs.
  __m128i in0 = _mm_loadu_si128((__m128i*)&in[0]);
  __m128i in8 = _mm_loadu_si128((__m128i*)&in[8]);
  const __m128i iq0 = _mm_loadu_si128((const __m128i*)&mtx->iq_[0]);
  const __m128i iq8 = _mm_loadu_si128((const __m128i*)&mtx->iq_[8]);
  const __m128i q0 = _mm_loadu_si128((const __m128i*)&mtx->q_[0]);
  const __m128i q8 = _mm_loadu_si128((const __m128i*)&mtx->q_[8]);

  // extract sign(in)  (0x0000 if positive, 0xffff if negative)
  const __m128i sign0 = _mm_cmpgt_epi16(zero, in0);
  const __m128i sign8 = _mm_cmpgt_epi16(zero, in8);

  // coeff = abs(in) = (in ^ sign) - sign
  coeff0 = _mm_xor_si128(in0, sign0);
  coeff8 = _mm_xor_si128(in8, sign8);
  coeff0 = _mm_sub_epi16(coeff0, sign0);
  coeff8 = _mm_sub_epi16(coeff8, sign8);

  // coeff = abs(in) + sharpen
  if (sharpen != NULL) {
    const __m128i sharpen0 = _mm_loadu_si128((const __m128i*)&sharpen[0]);
    const __m128i sharpen8 = _mm_loadu_si128((const __m128i*)&sharpen[8]);
    coeff0 = _mm_add_epi16(coeff0, sharpen0);
    coeff8 = _mm_add_epi16(coeff8, sharpen8);
  }

  // out = (coeff * iQ + B) >> QFIX
  {
    // doing calculations with 32b precision (QFIX=17)
    // out = (coeff * iQ)
    const __m128i coeff_iQ0H = _mm_mulhi_epu16(coeff0, iq0);
    const __m128i coeff_iQ0L = _mm_mullo_epi16(coeff0, iq0);
    const __m128i coeff_iQ8H = _mm_mulhi_epu16(coeff8, iq8);
    const __m128i coeff_iQ8L = _mm_mullo_epi16(coeff8, iq8);
    __m128i out_00 = _mm_unpacklo_epi16(coeff_iQ0L, coeff_iQ0H);
    __m128i out_04 = _mm_unpackhi_epi16(coeff_iQ0L, coeff_iQ0H);
    __m128i out_08 = _mm_unpacklo_epi16(coeff_iQ8L, coeff_iQ8H);
    __m128i out_12 = _mm_unpackhi_epi16(coeff_iQ8L, coeff_iQ8H);
    // out = (coeff * iQ + B)
    const __m128i bias_00 = _mm_loadu_si128((const __m128i*)&mtx->bias_[0]);
    const __m128i bias_04 = _mm_loadu_si128((const __m128i*)&mtx->bias_[4]);
    const __m128i bias_08 = _mm_loadu_si128((const __m128i*)&mtx->bias_[8]);
    const __m128i bias_12 = _mm_loadu_si128((const __m128i*)&mtx->bias_[12]);
    out_00 = _mm_add_epi32(out_00, bias_00);
    out_04 = _mm_add_epi32(out_04, bias_04);
    out_08 = _mm_add_epi32(out_08, bias_08);
    out_12 = _mm_add_epi32(out_12, bias_12);
    // out = QUANTDIV(coeff, iQ, B, QFIX)
    out_00 = _mm_srai_epi32(out_00, QFIX);
    out_04 = _mm_srai_epi32(out_04, QFIX);
    out_08 = _mm_srai_epi32(out_08, QFIX);
    out_12 = _mm_srai_epi32(out_12, QFIX);

    // pack result as 16b
    out0 = _mm_packs_epi32(out_00, out_04);
    out8 = _mm_packs_epi32(out_08, out_12);

    // if (coeff > 2047) coeff = 2047
    out0 = _mm_min_epi16(out0, max_coeff_2047);
    out8 = _mm_min_epi16(out8, max_coeff_2047);
  }

  // get sign back (if (sign[j]) out_n = -out_n)
  out0 = _mm_xor_si128(out0, sign0);
  out8 = _mm_xor_si128(out8, sign8);
  out0 = _mm_sub_epi16(out0, sign0);
  out8 = _mm_sub_epi16(out8, sign8);

  // in = out * Q
  in0 = _mm_mullo_epi16(out0, q0);
  in8 = _mm_mullo_epi16(out8, q8);

  _mm_storeu_si128((__m128i*)&in[0], in0);
  _mm_storeu_si128((__m128i*)&in[8], in8);

  // zigzag the output before storing it.
  //
  // The zigzag pattern can almost be reproduced with a small sequence of
  // shuffles. After it, we only need to swap the 7th (ending up in third
  // position instead of twelfth) and 8th values.
  {
    __m128i outZ0, outZ8;
    outZ0 = _mm_shufflehi_epi16(out0,  _MM_SHUFFLE(2, 1, 3, 0));
    outZ0 = _mm_shuffle_epi32  (outZ0, _MM_SHUFFLE(3, 1, 2, 0));
    outZ0 = _mm_shufflehi_epi16(outZ0, _MM_SHUFFLE(3, 1, 0, 2));
    outZ8 = _mm_shufflelo_epi16(out8,  _MM_SHUFFLE(3, 0, 2, 1));
    outZ8 = _mm_shuffle_epi32  (outZ8, _MM_SHUFFLE(3, 1, 2, 0));
    outZ8 = _mm_shufflelo_epi16(outZ8, _MM_SHUFFLE(1, 3, 2, 0));
    _mm_storeu_si128((__m128i*)&out[0], outZ0);
    _mm_storeu_si128((__m128i*)&out[8], outZ8);
    packed_out = _mm_packs_epi16(outZ0, outZ8);
  }
  {
    const int16_t outZ_12 = out[12];
    const int16_t outZ_3 = out[3];
    out[3] = outZ_12;
    out[12] = outZ_3;
  }

  // detect if all 'out' values are zeroes or not
  return (_mm_movemask_epi8(_mm_cmpeq_epi8(packed_out, zero)) != 0xffff);
}